

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

Point2f __thiscall pbrt::PaddedSobolSampler::Get2D(PaddedSobolSampler *this)

{
  int textureIndex;
  undefined1 auVar1 [16];
  uint32_t a;
  uint64_t uVar2;
  CranleyPattersonRotator CVar3;
  float fVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar6 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar7 [64];
  float local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined1 auVar5 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  uVar2 = MixBits((long)*Options ^
                  (long)this->dimension << 0x10 ^
                  (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.y << 0x20 ^
                  (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.x << 0x30);
  a = PermutationElement(this->sampleIndex,this->samplesPerPixel,(uint32_t)uVar2);
  textureIndex = this->dimension;
  this->dimension = textureIndex + 2;
  if (this->randomizeStrategy == CranleyPatterson) {
    fVar4 = BlueNoise(textureIndex,(Point2i)(this->pixel).super_Tuple2<pbrt::Point2,_int>);
    CVar3.delta = vcvttss2usi_avx512f(ZEXT416((uint)(fVar4 * 4.2949673e+09)));
    local_38 = SobolSampleFloat<pbrt::CranleyPattersonRotator>((long)(int)a,0,CVar3);
    fVar4 = BlueNoise(textureIndex + 1,(Point2i)(this->pixel).super_Tuple2<pbrt::Point2,_int>);
    CVar3.delta = vcvttss2usi_avx512f(ZEXT416((uint)(fVar4 * 4.2949673e+09)));
    auVar6._0_4_ = SobolSampleFloat<pbrt::CranleyPattersonRotator>((long)(int)a,1,CVar3);
    auVar6._4_60_ = extraout_var;
    auVar5 = auVar6._0_16_;
    uStack_34 = extraout_XMM0_Db;
    uStack_30 = extraout_XMM0_Dc;
    uStack_2c = extraout_XMM0_Dd;
  }
  else {
    local_38 = SampleDimension(this,0,a,(uint32_t)(uVar2 >> 8));
    auVar7._0_4_ = SampleDimension(this,1,a,(uint32_t)(uVar2 >> 0x20));
    auVar7._4_60_ = extraout_var_00;
    auVar5 = auVar7._0_16_;
    uStack_34 = extraout_XMM0_Db_00;
    uStack_30 = extraout_XMM0_Dc_00;
    uStack_2c = extraout_XMM0_Dd_00;
  }
  auVar1._4_4_ = uStack_34;
  auVar1._0_4_ = local_38;
  auVar1._8_4_ = uStack_30;
  auVar1._12_4_ = uStack_2c;
  auVar5 = vinsertps_avx(auVar1,auVar5,0x10);
  return (Point2f)auVar5._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        // Get permuted index for current pixel sample
        uint64_t hash = MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                                ((uint64_t)dimension << 16) ^ GetOptions().seed);
        int index = PermutationElement(sampleIndex, samplesPerPixel, hash);

        int dim = dimension;
        dimension += 2;
        // Return randomized 2D Sobol' sample
        if (randomizeStrategy == RandomizeStrategy::CranleyPatterson) {
            // Return 2D sample randomized with Cranley-Patterson rotation
            return {SobolSample(index, 0, CranleyPattersonRotator(BlueNoise(dim, pixel))),
                    SobolSample(index, 1,
                                CranleyPattersonRotator(BlueNoise(dim + 1, pixel)))};

        } else
            return {SampleDimension(0, index, hash >> 8),
                    SampleDimension(1, index, hash >> 32)};
    }